

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

art_val_t * art_find(art_t *art,art_key_chunk_t *key)

{
  byte key1_to;
  uint8_t offset;
  byte bVar1;
  art_inner_node_t *node;
  long lVar2;
  art_val_t *paVar3;
  uint8_t in_R9B;
  byte key2_from;
  
  node = (art_inner_node_t *)art->root;
  if (node == (art_inner_node_t *)0x0) {
LAB_0011077c:
    paVar3 = (art_val_t *)0x0;
  }
  else {
    key2_from = 0;
    while (((ulong)node & 1) == 0) {
      key1_to = node->prefix_size;
      bVar1 = art_common_prefix(node->prefix,'\0',key1_to,key,key2_from,in_R9B);
      if ((bVar1 != key1_to) ||
         (node = (art_inner_node_t *)art_find_child(node,key[(ulong)key1_to + (ulong)key2_from]),
         node == (art_inner_node_t *)0x0)) goto LAB_0011077c;
      key2_from = key2_from + key1_to + 1;
    }
    paVar3 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
    if (key2_from < 6) {
      for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
        if (paVar3->key[lVar2] != key[lVar2]) {
          if (lVar2 == 6) {
            return paVar3;
          }
          goto LAB_0011077c;
        }
      }
    }
  }
  return paVar3;
}

Assistant:

art_val_t *art_find(const art_t *art, const art_key_chunk_t *key) {
    if (art->root == NULL) {
        return NULL;
    }
    return art_find_at(art->root, key, 0);
}